

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O3

uint16_t add_unique(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *data,vector<unsigned_short,_std::allocator<unsigned_short>_> *uniq_refs,
                   string *new_data,size_t hint)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer __s2;
  size_t sVar3;
  iterator __position;
  int iVar4;
  pointer pbVar5;
  long lVar6;
  unsigned_short uVar7;
  uint16_t idx;
  unsigned_short local_52;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_40;
  pointer local_38;
  
  pbVar1 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = hint * 0x20;
  local_50 = new_data;
  local_48 = data;
  local_40 = (vector<unsigned_short,std::allocator<unsigned_short>> *)uniq_refs;
  if (pbVar1 + hint != pbVar2) {
    __s2 = (new_data->_M_dataplus)._M_p;
    sVar3 = new_data->_M_string_length;
    do {
      if ((*(size_t *)((long)&pbVar1->_M_string_length + lVar6) == sVar3) &&
         ((sVar3 == 0 ||
          (iVar4 = bcmp(*(void **)((long)&(pbVar1->_M_dataplus)._M_p + lVar6),__s2,sVar3),
          iVar4 == 0)))) {
        return (unsigned_short)((uint)lVar6 >> 5);
      }
      pbVar5 = (pointer)((long)&pbVar1[1]._M_dataplus._M_p + lVar6);
      lVar6 = lVar6 + 0x20;
    } while (pbVar5 != pbVar2);
  }
  if (hint != 0) {
    local_38 = (local_50->_M_dataplus)._M_p;
    sVar3 = local_50->_M_string_length;
    lVar6 = 0;
    uVar7 = 0;
    do {
      if (*(size_t *)((long)&pbVar1->_M_string_length + lVar6) == sVar3) {
        if (sVar3 == 0) {
          return uVar7;
        }
        iVar4 = bcmp(*(void **)((long)&(pbVar1->_M_dataplus)._M_p + lVar6),local_38,sVar3);
        if (iVar4 == 0) {
          return uVar7;
        }
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while (hint << 5 != lVar6);
  }
  uVar7 = (unsigned_short)((uint)((int)pbVar2 - (int)pbVar1) >> 5);
  local_52 = uVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_48,local_50);
  __position._M_current = *(unsigned_short **)(local_40 + 8);
  if (__position._M_current == *(unsigned_short **)(local_40 + 0x10)) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    _M_realloc_insert<unsigned_short_const&>(local_40,__position,&local_52);
  }
  else {
    *__position._M_current = uVar7;
    *(unsigned_short **)(local_40 + 8) = __position._M_current + 1;
    local_52 = uVar7;
  }
  return local_52;
}

Assistant:

static uint16_t add_unique(std::vector<std::string>* data, std::vector<uint16_t>& uniq_refs,
		const std::string& new_data, size_t hint)
{
	std::vector<std::string>::iterator it0 = data->begin();
	for (std::vector<std::string>::iterator it = it0 + hint,
			end = data->end(); it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	for (std::vector<std::string>::iterator it = it0,
			end = it0 + hint; it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	uint16_t idx = uint16_t(data->size() & UINT16_MAX);
	data->push_back(new_data);
	uniq_refs.push_back(idx);
	return idx;
}